

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

bool __thiscall
sptk::reaper::EpochTracker::GetLpcResidual
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  pointer pfVar1;
  pointer pfVar2;
  int iVar3;
  int iVar4;
  float *lpca;
  float *lpca_00;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int wsize;
  long lVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong local_b0;
  float preemp_rms;
  float norm_error;
  long local_98;
  long local_90;
  vector<float,_std::allocator<float>_> *local_88;
  long local_80;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  LpcAnalyzer lp;
  
  uVar7 = (uint)((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  if (((int)uVar7 < 1) ||
     (output == (vector<float,_std::allocator<float>_> *)0x0 || sample_rate <= 0.0)) {
LAB_0010dd77:
    bVar12 = false;
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(output,(ulong)(uVar7 & 0x7fffffff));
    iVar6 = (int)(this->lpc_frame_interval_ * sample_rate + 0.5);
    wsize = (int)(this->frame_duration_ * sample_rate + 0.5);
    local_b0 = (long)(int)(uVar7 - wsize) / (long)iVar6;
    iVar3 = (int)local_b0;
    local_b0 = local_b0 & 0xffffffff;
    if ((int)uVar7 < iVar3 * iVar6 + wsize) {
      local_b0 = (ulong)(iVar3 + 1);
    }
    else if (iVar3 < 1) goto LAB_0010dd77;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    uVar7 = (uint)(sample_rate / 1000.0 + 2.5);
    uVar9 = (ulong)uVar7;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    uVar13 = 0xffffffffffffffff;
    if (-2 < (int)uVar7) {
      uVar13 = (long)(int)(uVar7 + 1) << 2;
    }
    lpca = (float *)operator_new__(uVar13);
    lpca_00 = (float *)operator_new__(uVar13);
    pvVar5 = operator_new__(uVar13);
    norm_error = 0.0;
    preemp_rms = 0.0;
    iVar3 = LpcAnalyzer::ComputeLpc
                      (&lp,uVar7,this->noise_floor_,wsize,
                       (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start,lpca_00,(float *)0x0,(float *)0x0,
                       &norm_error,&preemp_rms,this->preemphasis_);
    if (iVar3 == 0) {
      bVar12 = false;
    }
    else {
      fVar15 = 0.0;
      uVar13 = (ulong)(uVar7 + 1);
      if (-1 < (int)uVar7) {
        pfVar1 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 0;
        do {
          *(undefined4 *)((long)pvVar5 + uVar8 * 4) = 0;
          pfVar1[uVar8] = 0.0;
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
        if (-1 < (int)uVar7) {
          fVar15 = 0.0;
          uVar8 = 0;
          do {
            fVar15 = fVar15 + lpca_00[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
        }
      }
      if ((int)local_b0 < 1) {
        bVar12 = true;
      }
      else {
        fVar15 = (float)(~-(uint)(0.0 < fVar15) & 0x3f800000 | (uint)fVar15 & -(uint)(0.0 < fVar15))
        ;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0;
        local_80 = (long)iVar6;
        local_98 = uVar9 + 1;
        lVar10 = 0;
        lVar14 = 0;
        iVar3 = wsize / 2 - uVar7;
        local_88 = output;
        do {
          local_90 = lVar10;
          local_78 = fVar15;
          iVar4 = LpcAnalyzer::ComputeLpc
                            (&lp,uVar7,this->noise_floor_,wsize,
                             (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar10,lpca,(float *)0x0,
                             (float *)0x0,&norm_error,&preemp_rms,this->preemphasis_);
          bVar12 = iVar4 != 0;
          if (iVar4 == 0) break;
          fVar15 = (float)iVar3;
          if ((int)uVar7 < 0) {
            fVar17 = (1.0 - local_78) / fVar15;
          }
          else {
            fVar17 = 0.0;
            uVar8 = 0;
            do {
              fVar17 = fVar17 + lpca[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
            fVar17 = ((float)(~-(uint)(0.0 < fVar17) & 0x3f800000 |
                             (uint)fVar17 & -(uint)(0.0 < fVar17)) - local_78) / fVar15;
            if (uVar7 != 0x7fffffff) {
              uVar8 = 0;
              do {
                *(float *)((long)pvVar5 + uVar8 * 4) = (lpca[uVar8] - lpca_00[uVar8]) / fVar15;
                uVar8 = uVar8 + 1;
              } while (uVar13 != uVar8);
            }
          }
          fVar15 = local_78;
          if (0 < iVar3) {
            pfVar1 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar2 = (local_88->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar14 = (long)(int)lVar14;
            uVar9 = (ulong)(int)uVar9;
            iVar4 = 0;
            do {
              lVar10 = lVar14;
              if ((int)uVar7 < 1) {
                fVar16 = 0.0;
              }
              else {
                fVar16 = 0.0;
                lVar11 = local_98;
                do {
                  fVar16 = fVar16 + pfVar1[lVar10] * lpca_00[lVar11 + -1];
                  lpca_00[lVar11 + -1] =
                       lpca_00[lVar11 + -1] + *(float *)((long)pvVar5 + lVar11 * 4 + -4);
                  lVar10 = lVar10 + 1;
                  lVar11 = lVar11 + -1;
                } while (1 < lVar11);
              }
              pfVar2[uVar9] = (fVar16 + pfVar1[(int)lVar10]) / fVar15;
              fVar15 = fVar15 + fVar17;
              iVar4 = iVar4 + 1;
              lVar14 = lVar14 + 1;
              uVar9 = uVar9 + 1;
            } while (iVar4 != iVar3);
          }
          iVar4 = (int)local_b0;
          local_b0 = (ulong)(iVar4 - 1);
          lVar10 = local_90 + local_80;
          iVar3 = iVar6;
        } while (1 < iVar4);
      }
    }
    operator_delete__(lpca);
    operator_delete__(lpca_00);
    operator_delete__(pvVar5);
    LpcAnalyzer::~LpcAnalyzer(&lp);
  }
  return bVar12;
}

Assistant:

bool EpochTracker::GetLpcResidual(const std::vector<float>& input, float sample_rate,
                                  std::vector<float>* output) {
  int32_t n_input = input.size();
  if (!((n_input > 0) && (sample_rate > 0.0) && output)) {
    return false;
  }
  output->resize(n_input);
  int32_t frame_step = RoundUp(sample_rate * lpc_frame_interval_);
  int32_t frame_size = RoundUp(sample_rate * frame_duration_);
  int32_t n_frames = 1 + ((n_input - frame_size) / frame_step);
  int32_t n_analyzed = ((n_frames - 1) * frame_step) + frame_size;
  // Must have one more than frame size to do a complete frame.
  if (n_analyzed <= n_input) {
    n_frames--;
    if (n_frames <= 0) {
      return false;
    }
  }
  LpcAnalyzer lp;
  int32_t order = lp.GetLpcOrder(sample_rate);
  float* lpc = new float[order + 1];
  float* old_lpc = new float[order + 1];
  float* delta_lpc = new float[order + 1];
  float norm_error = 0.0;
  float preemp_rms = 0.0;

#define  RELEASE_MEMORY() {                     \
    delete [] lpc;                              \
    delete [] old_lpc;                          \
    delete [] delta_lpc;                        \
  }

  if (!lp.ComputeLpc(order, noise_floor_, frame_size, &(input.front()),
                     old_lpc, NULL, NULL, &norm_error, &preemp_rms,
                     preemphasis_)) {
    RELEASE_MEMORY();
    return false;
  }
  for (int32_t i = 0; i <= order; ++i) {
    delta_lpc[i] = 0.0;
    (*output)[i] = 0.0;
  }
  float old_gain = LpcDcGain(old_lpc, order);
  float new_gain = 1.0;
  int32_t n_to_filter = (frame_size / 2) - order;  // How many samples
  // to process before
  // computing the next
  // LPC frame.
  int32_t input_p = 0;  // Where to get the next frame for LPC analysis
  int32_t output_p = order;  // where to store output samples.
  int32_t proc_p = 0;  // Where to pick up samples for input to the filter

  // Main processing loop:
  // Compute a new frame of LPC
  // Compute the DC gain for the new LPC
  // Compute delta DC gain.
  // Compute the LPC deltas.
  // For each point in the frame:
  //   Use old_lpc to produce an output point.
  //   Update the old LPCs and the DC gain
  // As soon as the center of the current frame is reached, compute
  // the LPC for the next frame.
  for ( ; n_frames > 0; --n_frames, input_p += frame_step,
            n_to_filter = frame_step) {
    if (!lp.ComputeLpc(order, noise_floor_, frame_size,
                       (&(input.front())) + input_p, lpc, NULL, NULL,
                       &norm_error, &preemp_rms, preemphasis_)) {
      RELEASE_MEMORY();
      return false;
    }
    new_gain = LpcDcGain(lpc, order);
    float delta_gain = (new_gain - old_gain) / n_to_filter;
    MakeDeltas(old_lpc, lpc, order+1, n_to_filter, delta_lpc);
    for (int32_t sample = 0; sample < n_to_filter; ++sample, ++proc_p,
             ++output_p) {
      float sum = 0.0;
      int32_t mem = proc_p;
      for (int32_t k = order; k > 0; --k, ++mem) {
        sum += (old_lpc[k] * input[mem]);
        old_lpc[k] += delta_lpc[k];
      }
      sum += input[mem];  // lpc[0] is always 1.0
      (*output)[output_p] = sum / old_gain;
      old_gain += delta_gain;
    }
  }
  RELEASE_MEMORY();
  return true;
}